

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

void prepare_next_level(player *p)

{
  ushort uVar1;
  player_upkeep *ppVar2;
  loc grid;
  loc grid_00;
  _Bool _Var3;
  short sVar4;
  int iVar5;
  char *pcVar6;
  object *obj;
  chunk_conflict *pcVar7;
  level_conflict *plVar8;
  chunk *pcVar9;
  chunk_conflict2 *pcVar10;
  loc_conflict lVar11;
  loc lVar12;
  square *psVar13;
  wchar_t width;
  ulong uVar14;
  char cVar15;
  wchar_t y;
  int y_00;
  wchar_t height;
  artifact *artifact;
  int iVar16;
  int x;
  bool bVar17;
  wchar_t min_width;
  wchar_t min_height;
  char *local_100;
  int local_f8;
  int local_f4;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  char new_name [80];
  char prev_name [80];
  
  cVar15 = '\x01';
  if ((p->opts).opt[0x2a] == false) {
    cVar15 = p->upkeep->arena_level;
  }
  pcVar6 = level_name(world->levels + p->last_place);
  my_strcpy(prev_name,pcVar6,0x50);
  pcVar6 = level_name(world->levels + p->place);
  my_strcpy(new_name,pcVar6,0x50);
  pcVar7 = cave;
  if (character_dungeon == true) {
    if (p->cave == (chunk_conflict2 *)0x0) {
      __assert_fail("p->cave",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                    ,0x6a4,"void prepare_next_level(struct player *)");
    }
    if (cVar15 == '\0') {
      if (cave->depth == 0) {
        pcVar7 = chunk_find_name(prev_name);
        if (pcVar7 == (chunk_conflict *)0x0) {
          cave_store((chunk *)cave,prev_name,false,false);
        }
        if (cave == (chunk_conflict *)0x0) goto LAB_0015acb6;
        pcVar9 = (chunk *)cave;
        if (p->cave != (chunk_conflict2 *)0x0) goto LAB_0015aac4;
      }
      else {
LAB_0015aac4:
        pcVar9 = (chunk *)cave;
        for (iVar5 = 0; iVar5 < ((chunk_conflict *)pcVar9)->height; iVar5 = iVar5 + 1) {
          for (iVar16 = 0; iVar16 < ((chunk_conflict *)pcVar9)->width; iVar16 = iVar16 + 1) {
            lVar12 = (loc)loc(iVar16,iVar5);
            for (obj = square_object((chunk_conflict *)pcVar9,lVar12); obj != (object *)0x0;
                obj = obj->next) {
              if (obj->artifact != (artifact *)0x0) {
                _Var3 = obj_is_known_artifact(obj);
                artifact = obj->artifact;
                if (((p->opts).opt[0x23] != false) || (_Var3)) {
                  history_lose_artifact(p,artifact);
                  artifact = obj->artifact;
                  _Var3 = true;
                }
                else {
                  _Var3 = false;
                }
                mark_artifact_created(artifact,_Var3);
              }
            }
          }
        }
        cave_free((chunk_conflict *)p->cave);
        p->cave = (chunk_conflict2 *)0x0;
      }
      wipe_mon_list(pcVar9,p);
      p->num_traps = '\0';
      cave_free((chunk_conflict *)pcVar9);
      cave = (chunk_conflict *)0x0;
      goto LAB_0015acb6;
    }
    if ((cave->name == (char *)0x0) || (iVar5 = strcmp(cave->name,"arena"), iVar5 != 0)) {
      compact_monsters((chunk *)pcVar7,L'\0');
      if (p->upkeep->arena_level == false) {
        lVar12.x = (p->grid).x;
        lVar12.y = (p->grid).y;
        square_set_mon(cave,lVar12,L'\0');
      }
      cave_store((chunk *)cave,prev_name,false,true);
      cave_store((chunk *)p->cave,prev_name,true,true);
    }
    else if (p->place == 0) {
      p->upkeep->arena_level = false;
      sVar4 = p->last_place;
      cVar15 = '\x01';
      if (sVar4 == 0) {
        sVar4 = p->home;
        p->last_place = sVar4;
        cVar15 = (p->opts).opt[0x2a];
      }
      player_change_place(p,(int)sVar4);
      ppVar2 = p->upkeep;
      ppVar2->arena_level = true;
      ppVar2->health_who = (monster *)0x0;
      pcVar6 = level_name(world->levels + p->last_place);
      my_strcpy(prev_name,pcVar6,0x50);
      pcVar6 = level_name(world->levels + p->place);
      my_strcpy(new_name,pcVar6,0x50);
      goto LAB_0015ac6d;
    }
LAB_0015ac72:
    pcVar7 = chunk_find_name(new_name);
    if ((pcVar7 != (chunk_conflict *)0x0) && (pcVar7 != cave)) {
      if (cave->name == (char *)0x0) {
        bVar17 = false;
      }
      else {
        iVar5 = strcmp(cave->name,"arena");
        bVar17 = iVar5 == 0;
      }
      pcVar6 = format("%s known");
      pcVar6 = string_make(pcVar6);
      pcVar10 = (chunk_conflict2 *)chunk_find_name(pcVar6);
      if (pcVar10 == (chunk_conflict2 *)0x0) {
        __assert_fail("old_known",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                      ,0x6df,"void prepare_next_level(struct player *)");
      }
      cave = pcVar7;
      p->cave = pcVar10;
      uVar1 = pcVar10->obj_max;
      for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
        if ((pcVar7->objects[uVar14] != (object *)0x0) &&
           (pcVar10->objects[uVar14] != (object *)0x0)) {
          pcVar7->objects[uVar14]->known = pcVar10->objects[uVar14];
        }
      }
      restore_monsters();
      pcVar7 = cave;
      if (bVar17) {
        iVar5 = 0;
        lVar11 = loc(0,0);
        _Var3 = loc_eq(p->old_grid,lVar11);
        if (_Var3) {
          for (; local_100 = pcVar6, iVar5 < cave->height; iVar5 = iVar5 + 1) {
            iVar16 = 0;
            while (iVar16 < cave->width) {
              lVar12 = (loc)loc(iVar16,iVar5);
              psVar13 = square(cave,lVar12);
              iVar16 = iVar16 + 1;
              if (psVar13->mon == -1) goto LAB_0015af80;
            }
            pcVar6 = local_100;
          }
          local_e8 = (ulong)(uint)pcVar7->monsters[1].grid.x;
          local_f0 = (ulong)(uint)pcVar7->monsters[1].grid.y;
          uVar14 = 1;
          pcVar6 = local_100;
          while (iVar5 = (int)uVar14, iVar5 != 10) {
            local_f4 = (int)local_f0 + iVar5;
            iVar16 = (int)local_e8;
            local_f8 = iVar16 - iVar5;
            local_e0 = uVar14;
            for (y_00 = (int)local_f0 - iVar5; x = local_f8, y_00 <= local_f4; y_00 = y_00 + 1) {
              for (; x <= iVar5 + iVar16; x = x + 1) {
                lVar12 = (loc)loc(x,y_00);
                _Var3 = square_in_bounds_fully(pcVar7,lVar12);
                if (((_Var3) && (_Var3 = square_isempty(pcVar7,lVar12), _Var3)) &&
                   (_Var3 = square_isvault(pcVar7,lVar12), !_Var3)) goto LAB_0015af80;
              }
              pcVar6 = local_100;
            }
            uVar14 = (ulong)((int)local_e0 + 1);
          }
          p->grid = pcVar7->monsters[1].grid;
          sanitize_player_loc((chunk *)pcVar7,p);
        }
        else {
          p->grid = p->old_grid;
          lVar11 = loc(0,0);
          p->old_grid = lVar11;
        }
        goto LAB_0015af89;
      }
      sanitize_player_loc((chunk *)cave,p);
      grid.x = (p->grid).x;
      grid.y = (p->grid).y;
      player_place((chunk_conflict2 *)cave,p,grid);
      goto LAB_0015af98;
    }
    if (p->upkeep->arena_level == true) {
      cave = (chunk_conflict *)cave_generate(p,L'\x06',L'\x06');
      event_signal_flag(EVENT_GEN_LEVEL_END,true);
      goto LAB_0015afb9;
    }
    min_height = L'\0';
    min_width = L'\0';
    plVar8 = level_by_name(world,world->levels[p->place].up);
    if (plVar8 != (level_conflict *)0x0) {
      pcVar6 = level_name(plVar8);
      pcVar9 = (chunk *)chunk_find_name(pcVar6);
      if (pcVar9 != (chunk *)0x0) {
        get_min_level_size(pcVar9,&min_height,&min_width,true);
      }
    }
    plVar8 = level_by_name(world,world->levels[p->place].down);
    height = min_height;
    width = min_width;
    if (plVar8 != (level_conflict *)0x0) {
      pcVar6 = level_name(plVar8);
      pcVar9 = (chunk *)chunk_find_name(pcVar6);
      height = min_height;
      width = min_width;
      if (pcVar9 != (chunk *)0x0) {
        get_min_level_size(pcVar9,&min_height,&min_width,false);
        height = min_height;
        width = min_width;
      }
    }
  }
  else {
LAB_0015ac6d:
    if (cVar15 != '\0') goto LAB_0015ac72;
LAB_0015acb6:
    height = L'\0';
    width = L'\0';
  }
  cave = (chunk_conflict *)cave_generate(p,height,width);
  event_signal_flag(EVENT_GEN_LEVEL_END,true);
LAB_0015afb9:
  if (((p->depth == 0) || (p->place == 0)) && (cave_known(p), p->place == 0)) {
    wiz_light((chunk *)cave,p,true);
  }
  else {
    pcVar7 = cave;
    _Var3 = is_daytime();
    cave_illuminate((chunk *)pcVar7,_Var3);
  }
  character_dungeon = true;
  return;
LAB_0015af80:
  (p->grid).x = lVar12.x;
  (p->grid).y = lVar12.y;
  pcVar6 = local_100;
LAB_0015af89:
  grid_00.x = (p->grid).x;
  grid_00.y = (p->grid).y;
  square_set_mon(pcVar7,grid_00,L'\xffffffff');
LAB_0015af98:
  chunk_list_remove(new_name);
  chunk_list_remove(pcVar6);
  string_free(pcVar6);
  goto LAB_0015afb9;
}

Assistant:

void prepare_next_level(struct player *p)
{
	bool persist = OPT(p, birth_levels_persist) || p->upkeep->arena_level;
	char prev_name[80];
	char new_name[80];

	my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
			  sizeof(prev_name));
	my_strcpy(new_name, level_name(&world->levels[p->place]), sizeof(new_name));

	/* Deal with any existing current level */
	if (character_dungeon) {
		assert (p->cave);

		if (persist) {
			/* Arenas don't get stored */
			if (!cave->name || !streq(cave->name, "arena")) {
				/* Tidy up */
				compact_monsters(cave, 0);
				if (!p->upkeep->arena_level) {
					/* Leave the player marker if going to an arena */
					square_set_mon(cave, p->grid, 0);
				}

				/* Save level and known level */
				cave_store(cave, prev_name, false, true);
				cave_store(p->cave, prev_name, true, true);
			} else if (!p->place) {
				/* Paranoia - try to catch unusual exits from Arena.  Ideally
				 * unusual exits never happen and this code is unnecessary */
				p->upkeep->arena_level = false;
				if (!p->last_place) {
					p->last_place = p->home; /* paranoia */
					persist = OPT(p, birth_levels_persist);
				}
				player_change_place(p, p->last_place);
				p->upkeep->arena_level = true;

				/* Suppress "defeated" message for unusual exit */
				p->upkeep->health_who = NULL;
				my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
				  sizeof(prev_name));
				my_strcpy(new_name, level_name(&world->levels[p->place]),
						  sizeof(new_name));
			}
		} else {
			/* Save the town */
			if (!cave->depth && !chunk_find_name(prev_name)) {
				cave_store(cave, prev_name, false, false);
			}

			/* Forget knowledge of old level */
			if (cave) {
				cave_clear(cave, p);
				cave = NULL;
			}
		}
	}

	/* Prepare the new level */
	if (persist) {
		/* Persistent levels need careful work */
		struct chunk *old_level = chunk_find_name(new_name);

		/* Check all the possibilities */
		if (old_level && (old_level != cave)) {
			/* We found an old level, load the known level and assign */
			int i;
			bool arena = cave->name && streq(cave->name, "arena");
			char *known_name = string_make(format("%s known", new_name));
			struct chunk *old_known = chunk_find_name(known_name);
			assert(old_known);

			/* Assign the new ones */
			cave = old_level;
			p->cave = old_known;

			/* Associate known objects */
			for (i = 0; i < p->cave->obj_max; i++) {
				if (cave->objects[i] && p->cave->objects[i]) {
					cave->objects[i]->known = p->cave->objects[i];
				}
			}

			/* Allow monsters to recover */
			restore_monsters();

			/* Leaving arenas requires special treatment */
			if (arena) {
				leave_arena(cave, p);
			} else {
				/* Map boundary changes may not cooperate with level teleport */
				sanitize_player_loc(cave, p);

				/* Place the player */
				player_place(cave, p, p->grid);
			}

			/* Remove from the list */
			chunk_list_remove(new_name);
			chunk_list_remove(known_name);
			string_free(known_name);
		} else if (p->upkeep->arena_level) {
			/* We're creating a new arena level */
			cave = cave_generate(p, 6, 6);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		} else {
			/* Creating a new level, make sure it joins existing ones right */
			struct level *lev;
			int min_height = 0, min_width = 0;

			/* Check level above */
			lev = level_by_name(world, world->levels[p->place].up);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, true);
				}
			}

			/* Check level below */
			lev = level_by_name(world, world->levels[p->place].down);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, false);
				}
			}

			/* Generate a new level */
			cave = cave_generate(p, min_height, min_width);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		}
	} else {
		/* Just generate a new level */
		cave = cave_generate(p, 0, 0);
		event_signal_flag(EVENT_GEN_LEVEL_END, true);
	}

	/* Know the town */
	if ((!(p->depth)) || (!(p->place))) {
		cave_known(p);
	}

	/* Apply illumination */
	if (p->place) cave_illuminate(cave, is_daytime());
	else wiz_light(cave, p, true);

	/* The dungeon is ready */
	character_dungeon = true;
}